

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_base.hpp
# Opt level: O2

void boost::detail::function::functor_manager<void_(*)(const_boost::debug::dbg_startup_info_&)>::
     manage(function_buffer *in_buffer,function_buffer *out_buffer,functor_manager_operation_type op
           )

{
  bool bVar1;
  pointer_____offset_0x10___ *ppuStack_18;
  
  if (op == get_functor_type_tag) {
    *(pointer_____offset_0x10___ **)out_buffer =
         &(*)(boost::debug::dbg_startup_info_const&)::typeinfo;
    *(char *)((long)out_buffer + 8) = '\0';
    *(char *)((long)out_buffer + 9) = '\0';
    return;
  }
  switch(op) {
  case clone_functor_tag:
    *(undefined8 *)out_buffer = *(undefined8 *)in_buffer;
    break;
  case move_functor_tag:
    *(undefined8 *)out_buffer = *(undefined8 *)in_buffer;
    *(undefined8 *)in_buffer = 0;
    break;
  case check_functor_type_tag:
    ppuStack_18 = &(*)(boost::debug::dbg_startup_info_const&)::typeinfo;
    bVar1 = typeindex::operator==
                      (*(type_info **)out_buffer,
                       (type_index_facade<boost::typeindex::stl_type_index,_std::type_info> *)
                       &ppuStack_18);
    if (bVar1) {
      *(function_buffer **)out_buffer = in_buffer;
      return;
    }
  case destroy_functor_tag:
    *(undefined8 *)out_buffer = 0;
    break;
  default:
    *(pointer_____offset_0x10___ **)out_buffer =
         &(*)(boost::debug::dbg_startup_info_const&)::typeinfo;
    *(char *)((long)out_buffer + 8) = '\0';
    *(char *)((long)out_buffer + 9) = '\0';
  }
  return;
}

Assistant:

static inline void
        manage(const function_buffer& in_buffer, function_buffer& out_buffer,
               functor_manager_operation_type op)
        {
          typedef typename get_function_tag<functor_type>::type tag_type;
          switch (op) {
          case get_functor_type_tag:
            out_buffer.members.type.type = &boost::typeindex::type_id<functor_type>().type_info();
            out_buffer.members.type.const_qualified = false;
            out_buffer.members.type.volatile_qualified = false;
            return;

          default:
            manager(in_buffer, out_buffer, op, tag_type());
            return;
          }
        }